

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::NextColumn(void)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiColumns *pIVar3;
  ImGuiContext *pIVar4;
  int column_index;
  uint uVar5;
  float fVar6;
  float fVar7;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if ((pIVar2->SkipItems == false) &&
     (pIVar3 = (pIVar2->DC).CurrentColumns, pIVar3 != (ImGuiColumns *)0x0)) {
    if (pIVar3->Count == 1) {
      (pIVar2->DC).CursorPos.x =
           (float)(int)((pIVar2->Pos).x + (pIVar2->DC).Indent.x + (pIVar2->DC).ColumnsOffset.x);
      if (pIVar3->Current != 0) {
        __assert_fail("columns->Current == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                      ,0x1d5d,"void ImGui::NextColumn()");
      }
    }
    else {
      PopItemWidth();
      PopClipRect();
      fVar1 = (pIVar4->Style).ItemSpacing.x;
      fVar6 = (pIVar2->DC).CursorPos.y;
      uVar5 = -(uint)(fVar6 <= pIVar3->LineMaxY);
      pIVar3->LineMaxY = (float)(~uVar5 & (uint)fVar6 | (uint)pIVar3->LineMaxY & uVar5);
      column_index = pIVar3->Current + 1;
      pIVar3->Current = column_index;
      if (column_index < pIVar3->Count) {
        fVar6 = GetColumnOffset(column_index);
        (pIVar2->DC).ColumnsOffset.x = (fVar6 - (pIVar2->DC).Indent.x) + fVar1;
        ImDrawListSplitter::SetCurrentChannel
                  (&pIVar2->DrawList->_Splitter,pIVar2->DrawList,pIVar3->Current + 1);
      }
      else {
        fVar6 = fVar1 - (pIVar2->WindowPadding).x;
        (pIVar2->DC).ColumnsOffset.x = (float)(-(uint)(0.0 <= fVar6) & (uint)fVar6);
        ImDrawListSplitter::SetCurrentChannel(&pIVar2->DrawList->_Splitter,pIVar2->DrawList,1);
        pIVar3->Current = 0;
        pIVar3->LineMinY = pIVar3->LineMaxY;
      }
      (pIVar2->DC).CursorPos.x =
           (float)(int)((pIVar2->Pos).x + (pIVar2->DC).Indent.x + (pIVar2->DC).ColumnsOffset.x);
      (pIVar2->DC).CursorPos.y = pIVar3->LineMinY;
      (pIVar2->DC).CurrLineSize.x = 0.0;
      (pIVar2->DC).CurrLineSize.y = 0.0;
      (pIVar2->DC).CurrLineTextBaseOffset = 0.0;
      PushColumnClipRect(pIVar3->Current);
      fVar6 = GetColumnOffset(pIVar3->Current);
      fVar7 = GetColumnOffset(pIVar3->Current + 1);
      PushItemWidth((fVar7 - fVar6) * 0.65);
      (pIVar2->WorkRect).Max.x = (fVar7 + (pIVar2->Pos).x) - fVar1;
    }
  }
  return;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}